

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_crl.cc
# Opt level: O2

int crl_cb(int operation,ASN1_VALUE **pval,ASN1_ITEM *it,void *exarg)

{
  byte *pbVar1;
  uint uVar2;
  X509_CRL *data;
  DIST_POINT_NAME *dpn;
  OPENSSL_STACK *sk;
  int iVar3;
  int iVar4;
  undefined8 in_RAX;
  ulong uVar5;
  X509_CRL_INFO *pXVar6;
  EVP_MD *type;
  ISSUING_DIST_POINT *pIVar7;
  X509_NAME *iname;
  AUTHORITY_KEYID *pAVar8;
  size_t sVar9;
  X509_EXTENSION *pXVar10;
  ASN1_OBJECT *o;
  OPENSSL_STACK *pOVar11;
  X509_REVOKED *x;
  ASN1_ENUMERATED *a;
  long lVar12;
  uint uVar13;
  size_t j;
  ulong i_00;
  char cVar14;
  size_t i_1;
  bool bVar15;
  int i;
  int local_34;
  
  data = (X509_CRL *)*pval;
  if (operation != 5) {
    if (operation == 3) {
      AUTHORITY_KEYID_free(data->akid);
      ISSUING_DIST_POINT_free(data->idp);
    }
    else if (operation == 1) {
      *(undefined8 *)&data->flags = 0;
      *(undefined8 *)((long)&data->akid + 4) = 0;
      *(undefined8 *)((long)&data->idp + 4) = 0;
    }
    return 1;
  }
  pXVar6 = data->crl;
  _i = in_RAX;
  if (pXVar6->version != (ASN1_INTEGER *)0x0) {
    uVar5 = ASN1_INTEGER_get(pXVar6->version);
    if (1 < uVar5) {
      iVar3 = 0x8c;
      iVar4 = 0x86;
      goto LAB_00196450;
    }
    if (uVar5 != 0) goto LAB_00196457;
    pXVar6 = data->crl;
  }
  if (pXVar6->extensions == (stack_st_X509_EXTENSION *)0x0) {
LAB_00196457:
    type = EVP_sha256();
    iVar3 = X509_CRL_digest(data,type,(uchar *)&data->idp_reasons,(uint *)0x0);
    if (iVar3 == 0) {
      return 0;
    }
    pIVar7 = (ISSUING_DIST_POINT *)X509_CRL_get_ext_d2i(data,0x302,&i,(int *)0x0);
    data->idp = pIVar7;
    if (pIVar7 == (ISSUING_DIST_POINT *)0x0) {
      if (i != -1) {
        return 0;
      }
    }
    else {
      uVar2 = data->idp_flags;
      uVar13 = uVar2 | 1;
      data->idp_flags = uVar13;
      cVar14 = 0 < pIVar7->onlyuser;
      if ((bool)cVar14) {
        uVar13 = uVar2 | 5;
        data->idp_flags = uVar13;
      }
      if (0 < pIVar7->onlyCA) {
        cVar14 = cVar14 + '\x01';
        uVar13 = uVar13 | 8;
        data->idp_flags = uVar13;
      }
      iVar3 = pIVar7->onlyattr;
      uVar2 = uVar13 | 0x10;
      if (iVar3 < 1) {
        uVar2 = uVar13;
      }
      bVar15 = (byte)(cVar14 + (0 < iVar3)) < 2;
      uVar13 = uVar2 | 2;
      if (bVar15) {
        uVar13 = uVar2;
      }
      if (0 < iVar3 || !bVar15) {
        data->idp_flags = uVar13;
      }
      if (0 < pIVar7->indirectCRL) {
        uVar13 = uVar13 | 0x20;
        data->idp_flags = uVar13;
      }
      if (pIVar7->onlysomereasons != (ASN1_BIT_STRING *)0x0) {
        data->idp_flags = uVar13 | 0x40;
      }
      dpn = pIVar7->distpoint;
      iname = X509_CRL_get_issuer((X509_CRL *)data);
      iVar3 = DIST_POINT_set_dpname(dpn,(X509_NAME *)iname);
      if (iVar3 == 0) {
        return 0;
      }
    }
    pAVar8 = (AUTHORITY_KEYID *)X509_CRL_get_ext_d2i(data,0x5a,&i,(int *)0x0);
    data->akid = pAVar8;
    if ((pAVar8 == (AUTHORITY_KEYID *)0x0) && (i != -1)) {
      return 0;
    }
    pOVar11 = (OPENSSL_STACK *)data->crl->extensions;
    uVar5 = 0;
    do {
      sVar9 = OPENSSL_sk_num(pOVar11);
      if (sVar9 <= uVar5) {
LAB_001965bf:
        pOVar11 = (OPENSSL_STACK *)X509_CRL_get_REVOKED((X509_CRL *)data);
        uVar5 = 0;
        do {
          sVar9 = OPENSSL_sk_num(pOVar11);
          if (sVar9 <= uVar5) {
            return 1;
          }
          x = (X509_REVOKED *)OPENSSL_sk_value(pOVar11,uVar5);
          a = (ASN1_ENUMERATED *)X509_REVOKED_get_ext_d2i(x,0x8d,&local_34,(int *)0x0);
          if ((a == (ASN1_ENUMERATED *)0x0) && (local_34 != -1)) {
            *(byte *)&data->flags = (byte)data->flags | 0x80;
            return 1;
          }
          if (a == (ASN1_ENUMERATED *)0x0) {
            *(undefined4 *)&x->issuer = 0xffffffff;
          }
          else {
            lVar12 = ASN1_ENUMERATED_get(a);
            *(int *)&x->issuer = (int)lVar12;
            ASN1_ENUMERATED_free(a);
          }
          sk = (OPENSSL_STACK *)x->extensions;
          i_00 = 0;
          do {
            sVar9 = OPENSSL_sk_num(sk);
            if (sVar9 <= i_00) goto LAB_00196663;
            pXVar10 = (X509_EXTENSION *)OPENSSL_sk_value(sk,i_00);
            iVar3 = X509_EXTENSION_get_critical(pXVar10);
            i_00 = i_00 + 1;
          } while (iVar3 == 0);
          pbVar1 = (byte *)((long)&data->flags + 1);
          *pbVar1 = *pbVar1 | 2;
LAB_00196663:
          uVar5 = uVar5 + 1;
        } while( true );
      }
      pXVar10 = (X509_EXTENSION *)OPENSSL_sk_value(pOVar11,uVar5);
      o = X509_EXTENSION_get_object(pXVar10);
      iVar3 = OBJ_obj2nid(o);
      iVar4 = X509_EXTENSION_get_critical(pXVar10);
      if (((iVar4 != 0) && (iVar3 != 0x5a)) && (iVar3 != 0x302)) {
        pbVar1 = (byte *)((long)&data->flags + 1);
        *pbVar1 = *pbVar1 | 2;
        goto LAB_001965bf;
      }
      uVar5 = uVar5 + 1;
    } while( true );
  }
  iVar3 = 0x8b;
  iVar4 = 0x8d;
LAB_00196450:
  ERR_put_error(0xb,0,iVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_crl.cc"
                ,iVar4);
  return 0;
}

Assistant:

static int crl_cb(int operation, ASN1_VALUE **pval, const ASN1_ITEM *it,
                  void *exarg) {
  X509_CRL *crl = (X509_CRL *)*pval;
  int i;

  switch (operation) {
    case ASN1_OP_NEW_POST:
      crl->idp = NULL;
      crl->akid = NULL;
      crl->flags = 0;
      crl->idp_flags = 0;
      break;

    case ASN1_OP_D2I_POST: {
      // The version must be one of v1(0) or v2(1).
      long version = X509_CRL_VERSION_1;
      if (crl->crl->version != NULL) {
        version = ASN1_INTEGER_get(crl->crl->version);
        // TODO(https://crbug.com/boringssl/364): |X509_CRL_VERSION_1|
        // should also be rejected. This means an explicitly-encoded X.509v1
        // version. v1 is DEFAULT, so DER requires it be omitted.
        if (version < X509_CRL_VERSION_1 || version > X509_CRL_VERSION_2) {
          OPENSSL_PUT_ERROR(X509, X509_R_INVALID_VERSION);
          return 0;
        }
      }

      // Per RFC 5280, section 5.1.2.1, extensions require v2.
      if (version != X509_CRL_VERSION_2 && crl->crl->extensions != NULL) {
        OPENSSL_PUT_ERROR(X509, X509_R_INVALID_FIELD_FOR_VERSION);
        return 0;
      }

      if (!X509_CRL_digest(crl, EVP_sha256(), crl->crl_hash, NULL)) {
        return 0;
      }

      crl->idp = reinterpret_cast<ISSUING_DIST_POINT *>(
          X509_CRL_get_ext_d2i(crl, NID_issuing_distribution_point, &i, NULL));
      if (crl->idp != NULL) {
        if (!setup_idp(crl, crl->idp)) {
          return 0;
        }
      } else if (i != -1) {
        return 0;
      }

      crl->akid = reinterpret_cast<AUTHORITY_KEYID *>(
          X509_CRL_get_ext_d2i(crl, NID_authority_key_identifier, &i, NULL));
      if (crl->akid == NULL && i != -1) {
        return 0;
      }

      // See if we have any unhandled critical CRL extensions and indicate
      // this in a flag. We only currently handle IDP so anything else
      // critical sets the flag. This code accesses the X509_CRL structure
      // directly: applications shouldn't do this.
      const STACK_OF(X509_EXTENSION) *exts = crl->crl->extensions;
      for (size_t idx = 0; idx < sk_X509_EXTENSION_num(exts); idx++) {
        const X509_EXTENSION *ext = sk_X509_EXTENSION_value(exts, idx);
        int nid = OBJ_obj2nid(X509_EXTENSION_get_object(ext));
        if (X509_EXTENSION_get_critical(ext)) {
          if (nid == NID_issuing_distribution_point ||
              nid == NID_authority_key_identifier) {
            continue;
          }
          crl->flags |= EXFLAG_CRITICAL;
          break;
        }
      }

      if (!crl_parse_entry_extensions(crl)) {
        return 0;
      }

      break;
    }

    case ASN1_OP_FREE_POST:
      AUTHORITY_KEYID_free(crl->akid);
      ISSUING_DIST_POINT_free(crl->idp);
      break;
  }
  return 1;
}